

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O2

mraa_result_t mraa_find_uart_bus_pci(char *pci_dev_path,char **dev_name)

{
  mraa_boolean_t mVar1;
  uint uVar2;
  char *pcVar3;
  int *piVar4;
  mraa_result_t mVar5;
  ulong uVar6;
  bool bVar7;
  dirent **namelist;
  char path [4096];
  
  snprintf(path,0xfff,"%s",pci_dev_path);
  mVar1 = mraa_file_exist(path);
  if (mVar1 == 0) {
    mVar5 = MRAA_ERROR_INVALID_PARAMETER;
  }
  else {
    uVar2 = scandir(path,(dirent ***)&namelist,(__selector *)0x0,alphasort);
    if ((int)uVar2 < 1) {
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      syslog(3,"Failed to find expected UART bus: %s",pcVar3);
      mVar5 = MRAA_ERROR_INVALID_RESOURCE;
    }
    else {
      pcVar3 = (char *)malloc(0x10);
      *dev_name = pcVar3;
      uVar6 = (ulong)uVar2;
      snprintf(pcVar3,0x10,"/dev/%s",namelist[uVar6 - 1]->d_name);
      while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
        free(namelist[uVar6]);
      }
      free(namelist);
      mVar5 = MRAA_SUCCESS;
      syslog(6,"UART device: %s selected for initialization",*dev_name);
    }
  }
  return mVar5;
}

Assistant:

mraa_result_t
mraa_find_uart_bus_pci(const char* pci_dev_path, char** dev_name)
{
    char path[PATH_MAX];
    const int max_allowable_len = 16;
    snprintf(path, PATH_MAX - 1, "%s", pci_dev_path);
    if (!mraa_file_exist(path)) {
        return MRAA_ERROR_INVALID_PARAMETER;
    }

    struct dirent** namelist;
    int n = scandir(path, &namelist, NULL, alphasort);
    if (n <= 0) {
        syslog(LOG_ERR, "Failed to find expected UART bus: %s", strerror(errno));
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    *dev_name = (char*) malloc(sizeof(char) * max_allowable_len);

    snprintf(*dev_name, max_allowable_len, "/dev/%s", namelist[n - 1]->d_name);
    while (n--) {
        free(namelist[n]);
    }
    free(namelist);
    syslog(LOG_INFO, "UART device: %s selected for initialization", *dev_name);
    return MRAA_SUCCESS;
}